

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O1

void __thiscall
Satyricon::Clause::Clause
          (Clause *this,bool l,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *lits
          )

{
  pointer __src;
  size_t __n;
  uint uVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,l);
  *(uint *)this = *(uint *)this & 0xfffffffe | uVar1;
  uVar2 = (long)(lits->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(lits->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
                _M_impl.super__Vector_impl_data._M_start;
  *(uint *)this = (uint)(uVar2 >> 1) & 0xfffffffe | uVar1;
  __src = (lits->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
          _M_impl.super__Vector_impl_data._M_start;
  __n = (long)(lits->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(this + 1,__src,__n);
  }
  if (l) {
    *(undefined8 *)((long)&this[1].field_0x0 + (uVar2 & 0x1fffffffc)) = 0x3ff0000000000000;
  }
  return;
}

Assistant:

Clause(bool l,const std::vector<Literal> &lits) :
        learned(l), _size(lits.size()) {
            std::copy(lits.begin(),lits.end(),this->begin());
            if ( learned ) get_activity() = 1.0;
        }